

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *structNode,Reader *replacement,uint64_t scopeId,
          uint64_t replacementScopeId)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  ElementCount EVar5;
  ushort uVar6;
  ElementCount index;
  ushort uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  Reader replacementFields;
  Reader fields;
  ListReader local_f8;
  ListReader local_c8;
  StructReader local_98;
  StructReader local_60;
  
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x80) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0xe);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x80) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0xe);
  }
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x80) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0xe);
    }
    if (uVar2 < 0x80) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0xe);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0xd0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x18);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0xd0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x18);
  }
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0xd0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x18);
    }
    if (uVar2 < 0xd0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x18);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x100) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x100) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
  }
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x100) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
    }
    if (uVar2 < 0x100) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if ((((0xff < uVar1) &&
       (pvVar3 = (replacement->_reader).data, *(short *)((long)pvVar3 + 0x1e) != 0)) &&
      (uVar2 = (structNode->_reader).dataSize, 0xff < uVar2)) &&
     (pvVar4 = (structNode->_reader).data, *(short *)((long)pvVar4 + 0x1e) != 0)) {
    iVar8 = 0;
    iVar9 = 0;
    if (0x11f < uVar1) {
      iVar9 = *(int *)((long)pvVar3 + 0x20);
    }
    if (0x11f < uVar2) {
      iVar8 = *(int *)((long)pvVar4 + 0x20);
    }
    if (iVar9 != iVar8) {
      checkCompatibility(this);
      return;
    }
  }
  bVar10 = (structNode->_reader).pointerCount < 4;
  local_f8.ptr = (byte *)((structNode->_reader).pointers + 3);
  if (bVar10) {
    local_f8.ptr = (byte *)(WirePointer *)0x0;
  }
  iVar9 = 0x7fffffff;
  local_f8.elementCount = (structNode->_reader).nestingLimit;
  if (bVar10) {
    local_f8.elementCount = 0x7fffffff;
    local_f8.segment._0_4_ = 0;
    local_f8.segment._4_4_ = 0;
    local_f8.capTable._0_4_ = 0;
    local_f8.capTable._4_4_ = 0;
  }
  else {
    local_f8.segment._0_4_ = *(undefined4 *)&(structNode->_reader).segment;
    local_f8.segment._4_4_ = *(undefined4 *)((long)&(structNode->_reader).segment + 4);
    local_f8.capTable._0_4_ = *(undefined4 *)&(structNode->_reader).capTable;
    local_f8.capTable._4_4_ = *(undefined4 *)((long)&(structNode->_reader).capTable + 4);
  }
  _::PointerReader::getList(&local_c8,(PointerReader *)&local_f8,INLINE_COMPOSITE,(word *)0x0);
  bVar10 = 3 < (replacement->_reader).pointerCount;
  local_98.data = (WirePointer *)0x0;
  if (bVar10) {
    iVar9 = (replacement->_reader).nestingLimit;
    local_98.data = (replacement->_reader).pointers + 3;
  }
  local_98.segment._0_4_ = 0;
  local_98.segment._4_4_ = 0;
  local_98.capTable._0_4_ = 0;
  local_98.capTable._4_4_ = 0;
  if (bVar10) {
    local_98.segment._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
    local_98.segment._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
    local_98.capTable._0_4_ = *(undefined4 *)&(replacement->_reader).capTable;
    local_98.capTable._4_4_ = *(undefined4 *)((long)&(replacement->_reader).capTable + 4);
  }
  local_98.pointers._0_4_ = iVar9;
  _::PointerReader::getList(&local_f8,(PointerReader *)&local_98,INLINE_COMPOSITE,(word *)0x0);
  EVar5 = local_c8.elementCount;
  if (local_f8.elementCount < local_c8.elementCount) {
    EVar5 = local_f8.elementCount;
  }
  if (local_c8.elementCount < local_f8.elementCount) {
    replacementIsNewer(this);
  }
  else if (local_f8.elementCount < local_c8.elementCount) {
    replacementIsOlder(this);
  }
  if (EVar5 != 0) {
    index = 0;
    do {
      _::ListReader::getStructElement(&local_98,&local_c8,index);
      _::ListReader::getStructElement(&local_60,&local_f8,index);
      checkCompatibility(this,(Reader *)&local_98,(Reader *)&local_60);
      index = index + 1;
    } while (EVar5 != index);
  }
  if (((structNode->_reader).dataSize < 0xe1) ||
     ((*(byte *)((long)(structNode->_reader).data + 0x1c) & 1) == 0)) {
    if ((0xe0 < (replacement->_reader).dataSize) &&
       ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) != 0)) {
      replacementIsNewer(this);
    }
  }
  else if (((replacement->_reader).dataSize < 0xe1) ||
          ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) == 0)) {
    replacementIsOlder(this);
  }
  else if (replacementScopeId != scopeId) {
    checkCompatibility(this);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Struct::Reader& structNode,
                          const schema::Node::Struct::Reader& replacement,
                          uint64_t scopeId, uint64_t replacementScopeId) {
    if (replacement.getDataWordCount() > structNode.getDataWordCount()) {
      replacementIsNewer();
    } else if (replacement.getDataWordCount() < structNode.getDataWordCount()) {
      replacementIsOlder();
    }
    if (replacement.getPointerCount() > structNode.getPointerCount()) {
      replacementIsNewer();
    } else if (replacement.getPointerCount() < structNode.getPointerCount()) {
      replacementIsOlder();
    }
    if (replacement.getDiscriminantCount() > structNode.getDiscriminantCount()) {
      replacementIsNewer();
    } else if (replacement.getDiscriminantCount() < structNode.getDiscriminantCount()) {
      replacementIsOlder();
    }

    if (replacement.getDiscriminantCount() > 0 && structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset(),
                      "union discriminant position changed");
    }

    // The shared members should occupy corresponding positions in the member lists, since the
    // lists are sorted by ordinal.
    auto fields = structNode.getFields();
    auto replacementFields = replacement.getFields();
    uint count = std::min(fields.size(), replacementFields.size());

    if (replacementFields.size() > fields.size()) {
      replacementIsNewer();
    } else if (replacementFields.size() < fields.size()) {
      replacementIsOlder();
    }

    for (uint i = 0; i < count; i++) {
      checkCompatibility(fields[i], replacementFields[i]);
    }

    // For the moment, we allow "upgrading" from non-group to group, mainly so that the
    // placeholders we generate for group parents (which in the absence of more info, we assume to
    // be non-groups) can be replaced with groups.
    //
    // TODO(cleanup):  The placeholder approach is really breaking down.  Maybe we need to maintain
    //   a list of expectations for nodes we haven't loaded yet.
    if (structNode.getIsGroup()) {
      if (replacement.getIsGroup()) {
        VALIDATE_SCHEMA(replacementScopeId == scopeId, "group node's scope changed");
      } else {
        replacementIsOlder();
      }
    } else {
      if (replacement.getIsGroup()) {
        replacementIsNewer();
      }
    }
  }